

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O1

void __thiscall
QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::~PromiseDataBase
          (PromiseDataBase<QString,_void_(const_QString_&)> *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~PromiseDataBase() { }